

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall libcellml::Variable::setInitialValue(Variable *this,VariablePtr *variable)

{
  element_type *this_00;
  VariableImpl *pVVar1;
  string local_38;
  VariablePtr *local_18;
  VariablePtr *variable_local;
  Variable *this_local;
  
  local_18 = variable;
  variable_local = (VariablePtr *)this;
  this_00 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)variable);
  NamedEntity::name_abi_cxx11_(&local_38,&this_00->super_NamedEntity);
  pVVar1 = pFunc(this);
  std::__cxx11::string::operator=((string *)&pVVar1->mInitialValue,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Variable::setInitialValue(const VariablePtr &variable)
{
    pFunc()->mInitialValue = variable->name();
}